

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

void test_dt_unsignedInt(void)

{
  char cVar1;
  bool bVar2;
  XSValue *pXVar3;
  char *pcVar4;
  wchar16 *pwVar5;
  long lVar6;
  char *pcVar7;
  void *pvVar8;
  int iVar9;
  int iVar10;
  Status myStatus;
  StrX local_f0;
  char lex_v_ran_iv_2 [3];
  char lex_v_ran_v_2 [2];
  Status myStatus_14;
  char lex_v_ran_v_2_canrep [2];
  char lex_v_ran_iv_2_canrep [3];
  char lex_v_ran_iv_1 [11];
  char lex_iv_2 [8];
  char lex_iv_1 [10];
  char lex_v_ran_v_1 [12];
  char data_canrep_2 [6];
  char data_canrep_1 [6];
  char data_rawstr_2 [9];
  char lex_v_ran_iv_1_canrep [11];
  char lex_v_ran_v_1_canrep [11];
  char data_rawstr_1 [14];
  char lex_v_ran_v_0 [12];
  
  builtin_strncpy(lex_v_ran_v_0,"   1234   \n",0xc);
  builtin_strncpy(lex_v_ran_v_1 + 8,"295",4);
  builtin_strncpy(lex_v_ran_v_1,"+4294967",8);
  lex_v_ran_v_2[0] = '0';
  lex_v_ran_v_2[1] = '\0';
  builtin_strncpy(lex_v_ran_iv_1,"4294967296",0xb);
  lex_v_ran_iv_2[2] = '\0';
  lex_v_ran_iv_2[0] = '-';
  lex_v_ran_iv_2[1] = '1';
  builtin_strncpy(lex_v_ran_v_1_canrep,"4294967295",0xb);
  lex_v_ran_v_2_canrep[0] = '0';
  lex_v_ran_v_2_canrep[1] = '\0';
  builtin_strncpy(lex_v_ran_iv_1_canrep,"4294967296",0xb);
  lex_v_ran_iv_2_canrep[2] = '\0';
  lex_v_ran_iv_2_canrep[0] = '-';
  lex_v_ran_iv_2_canrep[1] = '1';
  builtin_strncpy(lex_iv_1,"12b34.456",10);
  builtin_strncpy(lex_iv_2,"1234b56",8);
  builtin_strncpy(data_rawstr_1 + 8,"5   \n",6);
  builtin_strncpy(data_rawstr_1,"   +1234",8);
  builtin_strncpy(data_canrep_1,"12345",6);
  builtin_strncpy(data_rawstr_2,"00012345",9);
  builtin_strncpy(data_canrep_2,"12345",6);
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_f0,lex_v_ran_v_0);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f0);
  if (cVar1 == '\0') {
    StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa73,lex_v_ran_v_0,local_f0.fLocalForm,1);
    StrX::~StrX(&local_f0);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_f0,lex_v_ran_v_1);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f0);
  if (cVar1 == '\0') {
    StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa74,lex_v_ran_v_1,local_f0.fLocalForm,1);
    StrX::~StrX(&local_f0);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_f0,lex_v_ran_v_2);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f0);
  if (cVar1 == '\0') {
    StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa75,lex_v_ran_v_2,local_f0.fLocalForm,1);
    StrX::~StrX(&local_f0);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_f0,lex_v_ran_iv_1);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f0);
  if (cVar1 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      pcVar7 = local_f0.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xa78,lex_v_ran_iv_1,pcVar7,"st_FOCA0002",pcVar4);
      goto LAB_0011567d;
    }
  }
  else {
    StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa78,lex_v_ran_iv_1,local_f0.fLocalForm,0);
LAB_0011567d:
    StrX::~StrX(&local_f0);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_f0,lex_v_ran_iv_2);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f0);
  if (cVar1 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      pcVar7 = local_f0.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xa79,lex_v_ran_iv_2,pcVar7,"st_FOCA0002",pcVar4);
      goto LAB_00115747;
    }
  }
  else {
    StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa79,lex_v_ran_iv_2,local_f0.fLocalForm,0);
LAB_00115747:
    StrX::~StrX(&local_f0);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_f0,lex_iv_1);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f0);
  if (cVar1 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      pcVar7 = local_f0.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xa7c,lex_iv_1,pcVar7,"st_FOCA0002",pcVar4);
      goto LAB_00115811;
    }
  }
  else {
    StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa7c,lex_iv_1,local_f0.fLocalForm,0);
LAB_00115811:
    StrX::~StrX(&local_f0);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_f0,lex_iv_2);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f0);
  if (cVar1 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      pcVar7 = local_f0.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xa7d,lex_iv_2,pcVar7,"st_FOCA0002",pcVar4);
      goto LAB_001158db;
    }
  }
  else {
    StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa7d,lex_iv_2,local_f0.fLocalForm,0);
LAB_001158db:
    StrX::~StrX(&local_f0);
    errSeen = 1;
  }
  iVar10 = 2;
  while (iVar9 = iVar10 + -1, iVar10 != 0) {
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_f0,lex_v_ran_v_0);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f0);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xa9a,lex_v_ran_v_0);
      StrX::~StrX(&local_f0);
      errSeen = 1;
    }
    else {
      pvVar8 = (void *)(ulong)*(uint *)(pXVar3 + 8);
      if (*(uint *)(pXVar3 + 8) != 0x4d2) {
        printf("ACTVALUE_TEST Unexpected dt_unsignedIntXSValue, got %d expected %d\n",pvVar8,0x4d2);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_f0,lex_v_ran_v_1);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f0);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xa9c,lex_v_ran_v_1);
      StrX::~StrX(&local_f0);
      errSeen = 1;
    }
    else {
      pvVar8 = (void *)(ulong)*(uint *)(pXVar3 + 8);
      if (*(uint *)(pXVar3 + 8) != 0xffffffff) {
        printf("ACTVALUE_TEST Unexpected dt_unsignedIntXSValue, got %d expected %d\n",pvVar8,
               0xffffffffffffffff);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_f0,lex_v_ran_v_2);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f0);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xa9d,lex_v_ran_v_2);
      StrX::~StrX(&local_f0);
      errSeen = 1;
    }
    else {
      pvVar8 = (void *)(ulong)*(uint *)(pXVar3 + 8);
      if (*(uint *)(pXVar3 + 8) != 0) {
        printf("ACTVALUE_TEST Unexpected dt_unsignedIntXSValue, got %d expected %d\n",pvVar8,0);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_f0,lex_v_ran_iv_1);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f0);
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
        pcVar7 = local_f0.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xa9e,lex_v_ran_iv_1,pcVar7,"st_FOCA0002",pcVar4);
        StrX::~StrX(&local_f0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      pvVar8 = (void *)0xa9e;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xa9e,lex_v_ran_iv_1);
      StrX::~StrX(&local_f0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_f0,lex_v_ran_iv_2);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f0);
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
        pcVar7 = local_f0.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xa9f,lex_v_ran_iv_2,pcVar7,"st_FOCA0002",pcVar4);
        StrX::~StrX(&local_f0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      pvVar8 = (void *)0xa9f;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xa9f,lex_v_ran_iv_2);
      StrX::~StrX(&local_f0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_f0,lex_iv_1);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f0);
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
        pcVar7 = local_f0.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xaa1,lex_iv_1,pcVar7,"st_FOCA0002",pcVar4);
        StrX::~StrX(&local_f0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      pvVar8 = (void *)0xaa1;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xaa1,lex_iv_1);
      StrX::~StrX(&local_f0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_f0,lex_iv_2);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f0);
    iVar10 = iVar9;
    if (pXVar3 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
        pcVar7 = local_f0.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xaa2,lex_iv_2,pcVar7,"st_FOCA0002",pcVar4);
        StrX::~StrX(&local_f0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      pvVar8 = (void *)0xaa2;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xaa2,lex_iv_2);
      StrX::~StrX(&local_f0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar8);
    }
  }
  iVar10 = 2;
LAB_00115f09:
  iVar9 = iVar10 + -1;
  if (iVar10 != 0) {
    myStatus_14 = st_Init;
    StrX::StrX(&local_f0,data_rawstr_1);
    pwVar5 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus_14,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f0);
    if (pwVar5 == (wchar16 *)0x0) {
      StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xac0,data_rawstr_1);
      StrX::~StrX(&local_f0);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_1);
      if (!bVar2) {
        StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xac0,data_rawstr_1,local_f0.fLocalForm,_myStatus,data_canrep_1);
        StrX::~StrX(&local_f0);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_14 = st_Init;
    StrX::StrX(&local_f0,data_rawstr_2);
    pwVar5 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus_14,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f0);
    if (pwVar5 == (wchar16 *)0x0) {
      StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xac1,data_rawstr_2);
      StrX::~StrX(&local_f0);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_2);
      if (!bVar2) {
        StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xac1,data_rawstr_2,local_f0.fLocalForm,_myStatus,data_canrep_2);
        StrX::~StrX(&local_f0);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_14 = st_Init;
    StrX::StrX(&local_f0,lex_v_ran_v_1);
    pwVar5 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus_14,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f0);
    if (pwVar5 == (wchar16 *)0x0) {
      StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xac3,lex_v_ran_v_1);
      StrX::~StrX(&local_f0);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran_v_1_canrep);
      if (!bVar2) {
        StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xac3,lex_v_ran_v_1,local_f0.fLocalForm,_myStatus,lex_v_ran_v_1_canrep);
        StrX::~StrX(&local_f0);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_14 = st_Init;
    StrX::StrX(&local_f0,lex_v_ran_v_2);
    pwVar5 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus_14,ver_10,iVar10 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f0);
    if (pwVar5 == (wchar16 *)0x0) {
      StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xac4,lex_v_ran_v_2);
      StrX::~StrX(&local_f0);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran_v_2_canrep);
      if (!bVar2) {
        StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xac4,lex_v_ran_v_2,local_f0.fLocalForm,_myStatus,lex_v_ran_v_2_canrep);
        StrX::~StrX(&local_f0);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_f0,lex_iv_1);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus,ver_10,iVar10 == 2,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f0);
    if (lVar6 == 0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
        pcVar7 = local_f0.fLocalForm;
        pcVar4 = getStatusString(myStatus);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xac6,lex_iv_1,pcVar7,"st_FOCA0002",pcVar4);
        StrX::~StrX(&local_f0);
        goto LAB_0011641a;
      }
    }
    else {
      StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xac6,lex_iv_1);
      StrX::~StrX(&local_f0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0011641a:
      errSeen = 1;
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_f0,lex_iv_2);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus,ver_10,iVar10 == 2,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f0);
    iVar10 = iVar9;
    if (lVar6 == 0) goto LAB_001164a8;
    StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xac7,lex_iv_2);
    StrX::~StrX(&local_f0);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
    goto LAB_001164f7;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_f0,lex_v_ran_iv_1);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f0);
  if (lVar6 == 0) {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      pcVar7 = local_f0.fLocalForm;
      pcVar4 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xacc,lex_v_ran_iv_1,pcVar7,"st_FOCA0002",pcVar4);
      StrX::~StrX(&local_f0);
      goto LAB_001165e2;
    }
  }
  else {
    StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xacc,lex_v_ran_iv_1);
    StrX::~StrX(&local_f0);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_001165e2:
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_f0,lex_v_ran_iv_2);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f0);
  if (lVar6 == 0) {
    if (myStatus == st_FOCA0002) goto LAB_001166cc;
    StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    pcVar7 = local_f0.fLocalForm;
    pcVar4 = getStatusString(myStatus);
    printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0xacd,lex_v_ran_iv_2,pcVar7,"st_FOCA0002",pcVar4);
    StrX::~StrX(&local_f0);
  }
  else {
    StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xacd,lex_v_ran_iv_2);
    StrX::~StrX(&local_f0);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
  }
  errSeen = 1;
LAB_001166cc:
  myStatus_14 = st_Init;
  StrX::StrX(&local_f0,lex_v_ran_iv_1);
  pwVar5 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus_14,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f0);
  if (pwVar5 == (wchar16 *)0x0) {
    StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xad0,lex_v_ran_iv_1);
    StrX::~StrX(&local_f0);
    errSeen = 1;
  }
  else {
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    _myStatus = pcVar7;
    bVar2 = xercesc_4_0::XMLString::equals(pcVar7,lex_v_ran_iv_1_canrep);
    if (!bVar2) {
      StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xad0,lex_v_ran_iv_1,local_f0.fLocalForm,pcVar7,lex_v_ran_iv_1_canrep);
      StrX::~StrX(&local_f0);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_14 = st_Init;
  StrX::StrX(&local_f0,lex_v_ran_iv_2);
  pwVar5 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_f0.fUnicodeForm,dt_unsignedInt,&myStatus_14,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f0);
  if (pwVar5 == (wchar16 *)0x0) {
    StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xad1,lex_v_ran_iv_2,local_f0.fLocalForm);
    StrX::~StrX(&local_f0);
    errSeen = 1;
  }
  else {
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    _myStatus = pcVar7;
    bVar2 = xercesc_4_0::XMLString::equals(pcVar7,lex_v_ran_iv_2_canrep);
    if (!bVar2) {
      StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xad1,lex_v_ran_iv_2,local_f0.fLocalForm,pcVar7,lex_v_ran_iv_2_canrep);
      StrX::~StrX(&local_f0);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar5);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  return;
LAB_001164a8:
  if (myStatus != st_FOCA0002) {
    StrX::StrX(&local_f0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    pcVar7 = local_f0.fLocalForm;
    pcVar4 = getStatusString(myStatus);
    printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0xac7,lex_iv_2,pcVar7,"st_FOCA0002",pcVar4);
    StrX::~StrX(&local_f0);
LAB_001164f7:
    errSeen = 1;
  }
  goto LAB_00115f09;
}

Assistant:

void test_dt_unsignedInt()
{
    const XSValue::DataType dt = XSValue::dt_unsignedInt;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="   1234   \n";

    const char lex_v_ran_v_1[]="+4294967295";
    const char lex_v_ran_v_2[]="0";
    const char lex_v_ran_iv_1[]="4294967296";
    const char lex_v_ran_iv_2[]="-1";

    XSValue::XSValue_Data act_v_ran_v_0;  act_v_ran_v_0.fValue.f_uint = (unsigned int)1234;
    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_uint = (unsigned int)+4294967295;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_uint = (unsigned int)0;

    const char lex_v_ran_v_1_canrep[]="4294967295";
    const char lex_v_ran_v_2_canrep[]="0";
    const char lex_v_ran_iv_1_canrep[]="4294967296";
    const char lex_v_ran_iv_2_canrep[]="-1";

    const char lex_iv_1[]="12b34.456";
    const char lex_iv_2[]="1234b56";

/***
 * 3.3.22.2 Canonical representation
 *
 * The canonical representation for unsignedInt is defined by prohibiting certain options from the
 * Lexical representation (3.3.22.1). Specifically,
 * leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="   +12345   \n";
    const char data_canrep_1[]="12345";
    const char data_rawstr_2[]="00012345";
    const char data_canrep_2[]="12345";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, valid range
    VALIDATE_TEST(lex_v_ran_v_0  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, invalid range
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_0);

        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid                            XMLCh         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_1_canrep,  DONT_CARE);
        CANREP_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_2_canrep,  DONT_CARE);

        CANREP_TEST(lex_iv_1        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);

    }

    //validation on
    CANREP_TEST(lex_v_ran_iv_1, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
    CANREP_TEST(lex_v_ran_iv_2, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    //validation off
    CANREP_TEST(lex_v_ran_iv_1, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep, DONT_CARE);
    CANREP_TEST(lex_v_ran_iv_2, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep, DONT_CARE);
}